

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::Path::Path(Path *this,string *path,PathArgument *a1,PathArgument *a2,PathArgument *a3,
                PathArgument *a4,PathArgument *a5)

{
  vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *in_RDI;
  vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *in_stack_00000008
  ;
  InArgs in;
  vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *this_00;
  
  this_00 = in_RDI;
  std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::vector
            ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)0x12acbf);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::vector
            ((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_> *)
             0x12acce);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            (this_00,(value_type *)in_RDI);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            (this_00,(value_type *)in_RDI);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            (this_00,(value_type *)in_RDI);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            (this_00,(value_type *)in_RDI);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::push_back
            (this_00,(value_type *)in_RDI);
  makePath((Path *)a1,&a2->key_,(InArgs *)a3);
  std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::~vector
            (in_stack_00000008);
  return;
}

Assistant:

Path::Path(const std::string& path,
           const PathArgument& a1,
           const PathArgument& a2,
           const PathArgument& a3,
           const PathArgument& a4,
           const PathArgument& a5) {
  InArgs in;
  in.push_back(&a1);
  in.push_back(&a2);
  in.push_back(&a3);
  in.push_back(&a4);
  in.push_back(&a5);
  makePath(path, in);
}